

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSPI.cpp
# Opt level: O3

void __thiscall wasm::JSPI::run(JSPI *this,Module *module)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  pointer puVar3;
  Export *pEVar4;
  char *pcVar5;
  long lVar6;
  _Hash_node_base *p_Var7;
  _Hash_node_base *p_Var8;
  _Hash_node_base *p_Var9;
  HeapType HVar10;
  pointer puVar11;
  size_t sVar12;
  char *pcVar13;
  pointer pbVar14;
  bool bVar15;
  long *plVar16;
  undefined8 *puVar17;
  RefNull *pRVar18;
  string_view *psVar19;
  uintptr_t uVar20;
  __node_base_ptr p_Var21;
  Function *pFVar22;
  RefFunc *this_00;
  undefined1 reuse;
  string *defaultValue;
  size_type *psVar23;
  Function *pFVar24;
  __uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
  *p_Var25;
  ulong uVar26;
  undefined8 uVar27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *stateChanger;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *stateChanger_1;
  pointer pattern;
  string_view *psVar28;
  ulong uVar29;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar30;
  pointer puVar31;
  _Head_base<0UL,_wasm::Function_*,_false> _Var32;
  string_view sVar33;
  Name name;
  undefined1 local_238 [8];
  Split listedExports;
  string stateChangingImports;
  Split listedImports;
  string stateChangingExports;
  string *local_1b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  undefined1 local_180;
  HeapType local_178;
  pointer local_170;
  Builder local_168;
  Builder builder;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  pointer local_140;
  string_view local_138;
  string local_128;
  _Head_base<0UL,_wasm::Function_*,_false> _Stack_108;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> originalFunctions;
  undefined1 auStack_d8 [8];
  unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  wrappedExports;
  ulong local_98;
  __node_base local_90 [2];
  Module *local_80;
  string local_78;
  undefined1 local_58 [39];
  bool local_31;
  
  local_168.wasm = module;
  wrappedExports._M_h._M_single_bucket = local_90;
  local_80 = module;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&wrappedExports._M_h._M_single_bucket,"jspi-imports","");
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  Pass::getArgumentOrDefault
            ((string *)local_58,&this->super_Pass,(string *)&wrappedExports._M_h._M_single_bucket,
             &local_78);
  read_possible_response_file((string *)auStack_d8,(string *)local_58);
  String::trim((string *)&listedExports.needToHandleBracketingOperations,(string *)auStack_d8);
  psVar2 = &wrappedExports._M_h._M_bucket_count;
  if (auStack_d8 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_d8,wrappedExports._M_h._M_bucket_count + 1);
  }
  if ((Function *)local_58._0_8_ != (Function *)(local_58 + 0x10)) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (wrappedExports._M_h._M_single_bucket != local_90) {
    operator_delete(wrappedExports._M_h._M_single_bucket,
                    (ulong)((long)&(local_90[0]._M_nxt)->_M_nxt + 1));
  }
  auStack_d8 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_d8,",","");
  String::Split::Split
            ((Split *)((long)&stateChangingImports.field_2 + 8),
             (string *)&listedExports.needToHandleBracketingOperations,(string *)auStack_d8);
  if (auStack_d8 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_d8,wrappedExports._M_h._M_bucket_count + 1);
  }
  wrappedExports._M_h._M_single_bucket = local_90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&wrappedExports._M_h._M_single_bucket,"jspi-exports","");
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  defaultValue = &local_78;
  Pass::getArgumentOrDefault
            ((string *)local_58,&this->super_Pass,(string *)&wrappedExports._M_h._M_single_bucket,
             defaultValue);
  reuse = SUB81(defaultValue,0);
  read_possible_response_file((string *)auStack_d8,(string *)local_58);
  String::trim((string *)&listedImports.needToHandleBracketingOperations,(string *)auStack_d8);
  if (auStack_d8 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_d8,wrappedExports._M_h._M_bucket_count + 1);
  }
  if ((Function *)local_58._0_8_ != (Function *)(local_58 + 0x10)) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (wrappedExports._M_h._M_single_bucket != local_90) {
    operator_delete(wrappedExports._M_h._M_single_bucket,
                    (ulong)((long)&(local_90[0]._M_nxt)->_M_nxt + 1));
  }
  auStack_d8 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_d8,",","");
  String::Split::Split
            ((Split *)local_238,(string *)&listedImports.needToHandleBracketingOperations,
             (string *)auStack_d8);
  if (auStack_d8 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_d8,wrappedExports._M_h._M_bucket_count + 1);
  }
  auStack_d8 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_d8,"jspi-split-module","");
  local_31 = Pass::hasArgument(&this->super_Pass,(string *)auStack_d8);
  if (auStack_d8 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_d8,wrappedExports._M_h._M_bucket_count + 1);
  }
  HVar10.id = DAT_010b1d20.id;
  pcVar5 = ModuleSplitting::LOAD_SECONDARY_MODULE;
  if (local_31 == false) goto LAB_00917778;
  HeapType::HeapType(&local_178,(Signature)ZEXT816(0));
  auStack_d8 = (undefined1  [8])0x0;
  wrappedExports._M_h._M_buckets = (__buckets_ptr)0x0;
  wrappedExports._M_h._M_bucket_count = 0;
  name.super_IString.str._M_str = pcVar5;
  name.super_IString.str._M_len = (size_t)&_Stack_108;
  Builder::makeFunction
            (name,HVar10,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_178.id,
             (Expression *)auStack_d8);
  if (auStack_d8 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_d8,wrappedExports._M_h._M_bucket_count - (long)auStack_d8);
  }
  pcVar5 = DAT_010b0e58;
  ((_Stack_108._M_head_impl)->super_Importable).module.super_IString.str._M_len = ENV;
  ((_Stack_108._M_head_impl)->super_Importable).module.super_IString.str._M_str = pcVar5;
  pcVar5 = (char *)DAT_010b1d20.id;
  ((_Stack_108._M_head_impl)->super_Importable).base.super_IString.str._M_len =
       (size_t)ModuleSplitting::LOAD_SECONDARY_MODULE;
  ((_Stack_108._M_head_impl)->super_Importable).base.super_IString.str._M_str = pcVar5;
  Module::addFunction(local_80,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                               &_Stack_108);
  wrappedExports._M_h._M_single_bucket = local_90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&wrappedExports._M_h._M_single_bucket,DAT_010b0e58,DAT_010b0e58 + ENV);
  plVar16 = (long *)std::__cxx11::string::append((char *)&wrappedExports._M_h._M_single_bucket);
  local_58._0_8_ = local_58 + 0x10;
  pFVar22 = (Function *)(plVar16 + 2);
  if ((Function *)*plVar16 == pFVar22) {
    local_58._16_8_ = (pFVar22->super_Importable).super_Named.name.super_IString.str._M_len;
    local_58._24_4_ = (undefined4)plVar16[3];
    local_58._28_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
  }
  else {
    local_58._16_8_ = (pFVar22->super_Importable).super_Named.name.super_IString.str._M_len;
    local_58._0_8_ = (Function *)*plVar16;
  }
  local_58._8_8_ = plVar16[1];
  *plVar16 = (long)pFVar22;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,DAT_010b1d20.id,
             ModuleSplitting::LOAD_SECONDARY_MODULE + DAT_010b1d20.id);
  uVar26 = 0xf;
  if ((Function *)local_58._0_8_ != (Function *)(local_58 + 0x10)) {
    uVar26 = local_58._16_8_;
  }
  if (uVar26 < local_58._8_8_ + local_78._M_string_length) {
    uVar27 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      uVar27 = local_78.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar27 < local_58._8_8_ + local_78._M_string_length) goto LAB_00917681;
    puVar17 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,local_58._0_8_);
  }
  else {
LAB_00917681:
    puVar17 = (undefined8 *)
              std::__cxx11::string::_M_append(local_58,(ulong)local_78._M_dataplus._M_p);
  }
  psVar23 = puVar17 + 2;
  if ((size_type *)*puVar17 == psVar23) {
    wrappedExports._M_h._M_bucket_count = *psVar23;
    wrappedExports._M_h._M_before_begin._M_nxt = (_Hash_node_base *)puVar17[3];
    auStack_d8 = (undefined1  [8])psVar2;
  }
  else {
    wrappedExports._M_h._M_bucket_count = *psVar23;
    auStack_d8 = (undefined1  [8])*puVar17;
  }
  wrappedExports._M_h._M_buckets = (__buckets_ptr)puVar17[1];
  *puVar17 = psVar23;
  puVar17[1] = 0;
  *(undefined1 *)psVar23 = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             (stateChangingImports.field_2._M_local_buf + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_d8);
  reuse = SUB81(psVar23,0);
  if (auStack_d8 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_d8,wrappedExports._M_h._M_bucket_count + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((Function *)local_58._0_8_ != (Function *)(local_58 + 0x10)) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if (wrappedExports._M_h._M_single_bucket != local_90) {
    operator_delete(wrappedExports._M_h._M_single_bucket,
                    (ulong)((long)&(local_90[0]._M_nxt)->_M_nxt + 1));
  }
  if (_Stack_108._M_head_impl != (Function *)0x0) {
    std::default_delete<wasm::Function>::operator()
              ((default_delete<wasm::Function> *)&_Stack_108,_Stack_108._M_head_impl);
  }
LAB_00917778:
  sVar33 = IString::interned((IString *)&DAT_00000009,(string_view)ZEXT816(0xde8010),(bool)reuse);
  local_138 = (string_view)Names::getValidGlobalName(local_80,(Name)sVar33);
  uVar20 = (this->externref).id;
  pRVar18 = Builder::makeRefNull(&local_168,(HeapType)0x60);
  auStack_d8 = (undefined1  [8])operator_new(0x50);
  *(size_t *)((long)auStack_d8 + 0x40) = 0;
  *(size_t *)((long)auStack_d8 + 0x48) = 0;
  *(size_t *)((long)auStack_d8 + 0x30) = 0;
  *(size_t *)((long)auStack_d8 + 0x38) = 0;
  *(size_t *)((long)auStack_d8 + 0x20) = 0;
  *(size_t *)((long)auStack_d8 + 0x28) = 0;
  *(size_t *)((long)auStack_d8 + 0x10) = 0;
  *(size_t *)((long)auStack_d8 + 0x18) = 0;
  *(size_t *)auStack_d8 = local_138._M_len;
  *(char **)((long)auStack_d8 + 8) = local_138._M_str;
  *(uintptr_t *)((long)auStack_d8 + 0x38) = uVar20;
  *(RefNull **)((long)auStack_d8 + 0x40) = pRVar18;
  *(undefined1 *)((long)auStack_d8 + 0x48) = 1;
  Module::addGlobal(local_80,(unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
                             auStack_d8);
  if (auStack_d8 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_d8,0x50);
  }
  auStack_d8 = (undefined1  [8])&wrappedExports._M_h._M_rehash_policy._M_next_resize;
  wrappedExports._M_h._M_buckets = (__buckets_ptr)0x1;
  wrappedExports._M_h._M_bucket_count = 0;
  wrappedExports._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  wrappedExports._M_h._M_element_count._0_4_ = 0x3f800000;
  wrappedExports._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  wrappedExports._M_h._M_rehash_policy._4_4_ = 0;
  wrappedExports._M_h._M_rehash_policy._M_next_resize = 0;
  puVar3 = (local_80->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar30 = (local_80->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar30 != puVar3; puVar30 = puVar30 + 1
      ) {
    pEVar4 = (puVar30->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
             super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
    if (pEVar4->kind == Function) {
      pcVar5 = *(char **)((long)&(pEVar4->name).super_IString + 8);
      builder.wasm = (Module *)&local_150;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&builder,pcVar5,pcVar5 + *(long *)&(pEVar4->name).super_IString);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&stateChangingExports.field_2 + 8),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_238);
      uVar27 = stateChangingExports.field_2._8_8_;
      if ((string *)stateChangingExports.field_2._8_8_ == local_1b0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&stateChangingExports.field_2 + 8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)builder.wasm != &local_150) {
          operator_delete(builder.wasm,local_150._M_allocated_capacity + 1);
        }
      }
      else {
        do {
          bVar15 = String::wildcardMatch((string *)uVar27,(string *)&builder);
          uVar27 = uVar27 + 0x20;
        } while ((string *)uVar27 != local_1b0 && !bVar15);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&stateChangingExports.field_2 + 8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)builder.wasm != &local_150) {
          operator_delete(builder.wasm,local_150._M_allocated_capacity + 1);
        }
        if (!bVar15) goto LAB_009179f8;
      }
      pEVar4 = (puVar30->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      psVar28 = (string_view *)&pEVar4->value;
      if (*(__index_type *)
           ((long)&(pEVar4->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) != '\0')
      {
        psVar28 = (string_view *)0x0;
      }
      pFVar22 = Module::getFunction(local_80,(Name)*psVar28);
      pcVar5 = (pFVar22->super_Importable).super_Named.name.super_IString.str._M_str;
      p_Var21 = std::
                _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::_M_find_before_node
                          ((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            *)auStack_d8,(ulong)pcVar5 % (ulong)wrappedExports._M_h._M_buckets,
                           (key_type *)pFVar22,(__hash_code)pcVar5);
      if ((p_Var21 == (__node_base_ptr)0x0) || (p_Var21->_M_nxt == (_Hash_node_base *)0x0)) {
        sVar33 = (string_view)makeWrapperForExport(this,pFVar22,local_80,(Name)local_138);
        psVar19 = (string_view *)
                  std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)auStack_d8,(key_type *)pFVar22);
        *psVar19 = sVar33;
      }
      else {
        sVar33 = *(string_view *)(p_Var21->_M_nxt + 3);
      }
      *psVar28 = sVar33;
    }
LAB_009179f8:
  }
  p_Var25 = &((local_80->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_t;
  local_170 = (local_80->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if ((pointer)p_Var25 != local_170) {
    do {
      bVar15 = wasm::Type::isFunction
                         ((Type *)((long)&((Function *)
                                          (((pointer)p_Var25)->_M_t).
                                          super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                          .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                          _M_head_impl)->super_Importable + 0x30));
      if ((bVar15) &&
         (pFVar22 = (Function *)
                    (((pointer)p_Var25)->_M_t).
                    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                    .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl,
         uVar20 = (pFVar22->type).id, ((HeapType *)&pFVar22->profile)->id != uVar20)) {
        uVar26 = 0;
        uVar29 = 1;
        local_140 = (pointer)p_Var25;
        do {
          lVar6 = *(long *)(uVar20 + uVar26 * 8);
          if (((*(char *)lVar6 == '+') &&
              (p_Var21 = std::
                         _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::_M_find_before_node
                                   ((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                     *)auStack_d8,
                                    *(ulong *)(lVar6 + 0x18) % (ulong)wrappedExports._M_h._M_buckets
                                    ,(key_type *)(lVar6 + 0x10),*(ulong *)(lVar6 + 0x18)),
              p_Var21 != (__node_base_ptr)0x0)) &&
             (p_Var7 = p_Var21->_M_nxt, p_Var7 != (_Hash_node_base *)0x0)) {
            p_Var8 = p_Var7[3]._M_nxt;
            p_Var9 = p_Var7[4]._M_nxt;
            pFVar22 = Module::getFunction(local_80,(IString)*(IString *)&p_Var7[3]._M_nxt);
            HVar10.id = (pFVar22->type).id;
            this_00 = (RefFunc *)MixedArena::allocSpace(&(local_168.wasm)->allocator,0x20,8);
            (this_00->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression._id =
                 RefFuncId;
            (this_00->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression.type.id =
                 0;
            (this_00->func).super_IString.str._M_len = (size_t)p_Var8;
            (this_00->func).super_IString.str._M_str = (char *)p_Var9;
            RefFunc::finalize(this_00,HVar10);
            *(RefFunc **)
             ((((Function *)
               (local_140->_M_t).
               super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
               .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->type).id +
             uVar26 * 8) = this_00;
            p_Var25 = &local_140->_M_t;
          }
          pFVar22 = (Function *)
                    (((pointer)p_Var25)->_M_t).
                    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                    .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
          uVar20 = (pFVar22->type).id;
          bVar15 = uVar29 < (ulong)((long)(((HeapType *)&pFVar22->profile)->id - uVar20) >> 3);
          uVar26 = uVar29;
          uVar29 = (ulong)((int)uVar29 + 1);
        } while (bVar15);
      }
      p_Var25 = &((pointer)p_Var25)[1]._M_t;
    } while ((pointer)p_Var25 != local_170);
  }
  _Stack_108._M_head_impl = (Function *)0x0;
  originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar31 = (local_80->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar11 = (local_80->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar31 != puVar11) {
    do {
      local_58._0_8_ =
           (puVar31->_M_t).
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      std::vector<wasm::Function*,std::allocator<wasm::Function*>>::emplace_back<wasm::Function*>
                ((vector<wasm::Function*,std::allocator<wasm::Function*>> *)&_Stack_108,
                 (Function **)local_58);
      puVar31 = puVar31 + 1;
    } while (puVar31 != puVar11);
    local_140 = (pointer)originalFunctions.
                         super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                         _M_impl.super__Vector_impl_data._M_start;
    if (_Stack_108._M_head_impl !=
        (Function *)
        originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      _Var32._M_head_impl = _Stack_108._M_head_impl;
      do {
        pFVar22 = (Function *)
                  ((_Var32._M_head_impl)->super_Importable).super_Named.name.super_IString.str.
                  _M_len;
        pcVar5 = *(char **)&((Name *)((long)&pFVar22->super_Importable + 0x20))->super_IString;
        if (pcVar5 != (char *)0x0) {
          sVar12 = *(size_t *)&((Name *)((long)&pFVar22->super_Importable + 0x28))->super_IString;
          pcVar13 = *(char **)((long)&pFVar22->super_Importable + 0x30);
          wrappedExports._M_h._M_single_bucket = local_90;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&wrappedExports._M_h._M_single_bucket,pcVar5,
                     pcVar5 + *(size_t *)
                               &((Name *)((long)&pFVar22->super_Importable + 0x18))->super_IString);
          plVar16 = (long *)std::__cxx11::string::_M_replace_aux
                                      ((ulong)&wrappedExports._M_h._M_single_bucket,local_98,0,
                                       '\x01');
          local_58._0_8_ = local_58 + 0x10;
          pFVar24 = (Function *)(plVar16 + 2);
          if ((Function *)*plVar16 == pFVar24) {
            local_58._16_8_ = (pFVar24->super_Importable).super_Named.name.super_IString.str._M_len;
            local_58._24_4_ = (undefined4)plVar16[3];
            local_58._28_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
          }
          else {
            local_58._16_8_ = (pFVar24->super_Importable).super_Named.name.super_IString.str._M_len;
            local_58._0_8_ = (Function *)*plVar16;
          }
          local_58._8_8_ = plVar16[1];
          *plVar16 = (long)pFVar24;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,pcVar13,pcVar13 + sVar12);
          uVar26 = 0xf;
          if ((Function *)local_58._0_8_ != (Function *)(local_58 + 0x10)) {
            uVar26 = local_58._16_8_;
          }
          if (uVar26 < local_58._8_8_ + local_78._M_string_length) {
            uVar27 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              uVar27 = local_78.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar27 < local_58._8_8_ + local_78._M_string_length) goto LAB_00917ccd;
            puVar17 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,local_58._0_8_);
          }
          else {
LAB_00917ccd:
            puVar17 = (undefined8 *)
                      std::__cxx11::string::_M_append(local_58,(ulong)local_78._M_dataplus._M_p);
          }
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(puVar17 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar17 == paVar1) {
            local_128.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
            local_128.field_2._8_8_ = puVar17[3];
          }
          else {
            local_128.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
            local_128._M_dataplus._M_p = (pointer)*puVar17;
          }
          local_128._M_string_length = puVar17[1];
          *puVar17 = paVar1;
          puVar17[1] = 0;
          paVar1->_M_local_buf[0] = '\0';
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if ((Function *)local_58._0_8_ != (Function *)(local_58 + 0x10)) {
            operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
          }
          if (wrappedExports._M_h._M_single_bucket != local_90) {
            operator_delete(wrappedExports._M_h._M_single_bucket,
                            (ulong)((long)&(local_90[0]._M_nxt)->_M_nxt + 1));
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_198,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&stateChangingImports.field_2 + 8));
          pbVar14 = local_198.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          local_180 = listedImports.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_;
          pattern = local_198.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (local_198.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_198.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_198);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            do {
              bVar15 = String::wildcardMatch(pattern,&local_128);
              pattern = pattern + 1;
            } while (pattern != pbVar14 && !bVar15);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_198);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            if (!bVar15) goto LAB_00917e6d;
          }
          makeWrapperForImport(this,pFVar22,local_80,(Name)local_138,local_31);
        }
LAB_00917e6d:
        _Var32._M_head_impl =
             (Function *)
             &((_Var32._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str;
      } while (_Var32._M_head_impl != (Function *)local_140);
    }
    if (_Stack_108._M_head_impl != (Function *)0x0) {
      operator_delete(_Stack_108._M_head_impl,
                      (long)originalFunctions.
                            super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)_Stack_108._M_head_impl);
    }
  }
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)auStack_d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_238);
  if ((size_type *)listedImports._24_8_ != &stateChangingExports._M_string_length) {
    operator_delete((void *)listedImports._24_8_,stateChangingExports._M_string_length + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&stateChangingImports.field_2 + 8));
  if ((size_type *)listedExports._24_8_ != &stateChangingImports._M_string_length) {
    operator_delete((void *)listedExports._24_8_,stateChangingImports._M_string_length + 1);
  }
  return;
}

Assistant:

void run(Module* module) override {
    Builder builder(*module);

    // Find which imports can suspend.
    auto stateChangingImports = String::trim(
      read_possible_response_file(getArgumentOrDefault("jspi-imports", "")));
    String::Split listedImports(stateChangingImports, ",");

    // Find which exports should create a promise.
    auto stateChangingExports = String::trim(
      read_possible_response_file(getArgumentOrDefault("jspi-exports", "")));
    String::Split listedExports(stateChangingExports, ",");

    bool wasmSplit = hasArgument("jspi-split-module");
    if (wasmSplit) {
      // Make an import for the load secondary module function so a JSPI wrapper
      // version will be created.
      auto import =
        Builder::makeFunction(ModuleSplitting::LOAD_SECONDARY_MODULE,
                              Signature(Type::none, Type::none),
                              {});
      import->module = ENV;
      import->base = ModuleSplitting::LOAD_SECONDARY_MODULE;
      module->addFunction(std::move(import));
      listedImports.push_back(
        ENV.toString() + "." +
        ModuleSplitting::LOAD_SECONDARY_MODULE.toString());
    }

    // Create a global to store the suspender that is passed into exported
    // functions and will then need to be passed out to the imported functions.
    Name suspender = Names::getValidGlobalName(*module, "suspender");
    module->addGlobal(builder.makeGlobal(suspender,
                                         externref,
                                         builder.makeRefNull(HeapType::noext),
                                         Builder::Mutable));

    // Keep track of already wrapped functions since they can be exported
    // multiple times, but only one wrapper is needed.
    std::unordered_map<Name, Name> wrappedExports;

    // Wrap each exported function in a function that stores the suspender
    // and calls the original export.
    for (auto& ex : module->exports) {
      if (ex->kind == ExternalKind::Function &&
          canChangeState(ex->name.toString(), listedExports)) {
        auto* name = ex->getInternalName();
        auto* func = module->getFunction(*name);
        Name wrapperName;
        auto iter = wrappedExports.find(func->name);
        if (iter == wrappedExports.end()) {
          wrapperName = makeWrapperForExport(func, module, suspender);
          wrappedExports[func->name] = wrapperName;
        } else {
          wrapperName = iter->second;
        }
        *name = wrapperName;
      }
    }

    // Replace any references to the original exports that are in the elements.
    for (auto& segment : module->elementSegments) {
      if (!segment->type.isFunction()) {
        continue;
      }
      for (Index i = 0; i < segment->data.size(); i++) {
        if (auto* get = segment->data[i]->dynCast<RefFunc>()) {
          auto iter = wrappedExports.find(get->func);
          if (iter == wrappedExports.end()) {
            continue;
          }
          auto* replacementRef = builder.makeRefFunc(
            iter->second, module->getFunction(iter->second)->type);
          segment->data[i] = replacementRef;
        }
      }
    }

    // Avoid iterator invalidation later.
    std::vector<Function*> originalFunctions;
    for (auto& func : module->functions) {
      originalFunctions.push_back(func.get());
    }
    // Wrap each imported function in a function that gets the global suspender
    // and passes it on to the imported function.
    for (auto* im : originalFunctions) {
      if (im->imported() &&
          canChangeState(getFullFunctionName(im->module, im->base),
                         listedImports)) {
        makeWrapperForImport(im, module, suspender, wasmSplit);
      }
    }
  }